

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# State.h
# Opt level: O2

double __thiscall Iir::DirectFormI::filter(DirectFormI *this,double in,Biquad *s)

{
  double dVar1;
  
  dVar1 = ((s->m_b2 * this->m_x2 + s->m_b0 * in + s->m_b1 * this->m_x1) - this->m_y1 * s->m_a1) -
          s->m_a2 * this->m_y2;
  this->m_x2 = this->m_x1;
  this->m_y2 = this->m_y1;
  this->m_x1 = in;
  this->m_y1 = dVar1;
  return dVar1;
}

Assistant:

inline double filter(const double in,
			     const Biquad& s)
	{
		const double out = s.m_b0*in + s.m_b1*m_x1 + s.m_b2*m_x2
		- s.m_a1*m_y1 - s.m_a2*m_y2;
		m_x2 = m_x1;
		m_y2 = m_y1;
		m_x1 = in;
		m_y1 = out;
		
		return out;
	}